

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesPathWidget.cxx
# Opt level: O3

void __thiscall cmCursesPathWidget::OnTab(cmCursesPathWidget *this,cmCursesMainForm *fm,WINDOW *w)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FORM *form;
  size_t __n;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  string cstr;
  string glob;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string local_a8;
  string local_88;
  long *local_68 [2];
  long local_58 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pcVar4 = cmCursesStringWidget::GetString(&this->super_cmCursesStringWidget);
  if (pcVar4 != (char *)0x0) {
    form = (fm->super_cmCursesForm).Form;
    form_driver(form,0x204);
    form_driver(form,0x205);
    pcVar4 = cmCursesStringWidget::GetString(&this->super_cmCursesStringWidget);
    std::__cxx11::string::string((string *)&local_a8,pcVar4,(allocator *)&local_88);
    std::__cxx11::string::find_last_not_of((char *)&local_a8,0x4bc2db,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_a8);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_88);
    paVar1 = &local_88.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
    __n = (this->LastString)._M_string_length;
    if ((__n != local_a8._M_string_length) ||
       ((__n != 0 &&
        (iVar3 = bcmp((this->LastString)._M_dataplus._M_p,local_a8._M_dataplus._M_p,__n), iVar3 != 0
        )))) {
      this->Cycle = false;
      this->CurrentIndex = 0;
      std::__cxx11::string::_M_replace
                ((ulong)&this->LastGlob,0,(char *)(this->LastGlob)._M_string_length,0x50caef);
    }
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)paVar1;
    if (this->Cycle == true) {
      std::__cxx11::string::_M_assign((string *)&local_88);
    }
    else {
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,local_a8._M_dataplus._M_p,
                 local_a8._M_dataplus._M_p + local_a8._M_string_length);
      std::__cxx11::string::append((char *)local_68);
      std::__cxx11::string::operator=((string *)&local_88,(string *)local_68);
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
    }
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmSystemTools::SimpleGlob
              (&local_88,&local_48,
               -(uint)((this->super_cmCursesStringWidget).super_cmCursesWidget.Type == PATH));
    if (this->CurrentIndex <
        (ulong)((long)local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      std::__cxx11::string::_M_assign((string *)&local_a8);
    }
    if (local_a8._M_dataplus._M_p[local_a8._M_string_length - 1] == '*') {
      std::__cxx11::string::substr((ulong)local_68,(ulong)&local_a8);
      std::__cxx11::string::operator=((string *)&local_a8,(string *)local_68);
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
    }
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_a8);
    if (bVar2) {
      std::__cxx11::string::append((char *)&local_a8);
    }
    cmCursesStringWidget::SetString(&this->super_cmCursesStringWidget,&local_a8);
    if (w == (WINDOW *)0x0) {
      iVar3 = -1;
    }
    else {
      iVar3 = w->_maxy + 1;
    }
    wtouchln(w,0,iVar3,1);
    wrefresh(w);
    form_driver(form,0x217);
    std::__cxx11::string::_M_assign((string *)&this->LastGlob);
    std::__cxx11::string::_M_assign((string *)&this->LastString);
    this->Cycle = true;
    uVar5 = this->CurrentIndex + 1;
    uVar6 = 0;
    if (uVar5 < (ulong)((long)local_48.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_48.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      uVar6 = uVar5;
    }
    this->CurrentIndex = uVar6;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmCursesPathWidget::OnTab(cmCursesMainForm* fm, WINDOW* w)
{
  if ( !this->GetString() )
    {
    return;
    }
  FORM* form = fm->GetForm();
  form_driver(form, REQ_NEXT_FIELD);
  form_driver(form, REQ_PREV_FIELD);
  std::string cstr = this->GetString();
  cstr = cstr.substr(0, cstr.find_last_not_of(" \t\n\r")+1);
  if ( this->LastString != cstr )
    {
    this->Cycle = false;
    this->CurrentIndex = 0;
    this->LastGlob = "";
    }
  std::string glob;
  if ( this->Cycle )
    {
    glob = this->LastGlob;
    }
  else
    {
    glob = cstr + "*";
    }
  std::vector<std::string> dirs;

  cmSystemTools::SimpleGlob(glob, dirs, (this->Type == cmState::PATH?-1:0));
  if ( this->CurrentIndex < dirs.size() )
    {
    cstr = dirs[this->CurrentIndex];
    }
  if ( cstr[cstr.size()-1] == '*' )
    {
    cstr = cstr.substr(0, cstr.size()-1);
    }

  if ( cmSystemTools::FileIsDirectory(cstr) )
    {
    cstr += "/";
    }

  this->SetString(cstr);
  touchwin(w);
  wrefresh(w);
  form_driver(form, REQ_END_FIELD);
  this->LastGlob = glob;
  this->LastString = cstr;
  this->Cycle = true;
  this->CurrentIndex ++;
  if ( this->CurrentIndex >= dirs.size() )
    {
    this->CurrentIndex = 0;
    }
}